

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O1

WJTL_STATUS TestMarshallArrayStrings(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  StringStruct theStruct;
  JlMarshallElement marshalStringStruct [2];
  char *someStrings [10];
  char *local_188;
  char *pcStack_180;
  char *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  char **ppcStack_160;
  undefined8 local_158;
  JlMarshallElement local_148 [2];
  char *local_88;
  char *pcStack_80;
  char *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  memcpy(local_148,&DAT_00141a70,0xc0);
  local_158 = 0;
  local_168 = 0;
  ppcStack_160 = (char **)0x0;
  local_178 = (char *)0x0;
  uStack_170 = 0;
  local_188 = (char *)0x0;
  pcStack_180 = (char *)0x0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = (char *)0x0;
  uStack_70 = 0;
  local_88 = (char *)0x0;
  pcStack_80 = (char *)0x0;
  WVar1 = MakeJsonAndVerify(&local_188,local_148,2,"{\"ArrayStrFixed\":[],\"StrArray\":[]}");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[],\\\"StrArray\\\":[]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xc4);
  local_188 = (char *)0x0;
  local_168 = 1;
  local_158 = 1;
  ppcStack_160 = &local_88;
  WVar2 = MakeJsonAndVerify(&local_188,local_148,2,"{\"ArrayStrFixed\":[null],\"StrArray\":[null]}")
  ;
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[null],\\\"StrArray\\\":[null]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xcd);
  local_188 = anon_var_dwarf_429 + 10;
  local_168 = 1;
  local_88 = anon_var_dwarf_429 + 10;
  local_158 = 1;
  ppcStack_160 = &local_88;
  WVar3 = MakeJsonAndVerify(&local_188,local_148,2,"{\"ArrayStrFixed\":[null],\"StrArray\":[null]}")
  ;
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[null],\\\"StrArray\\\":[null]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xd7);
  local_188 = "a";
  pcStack_180 = "b";
  local_178 = "c";
  local_168 = 3;
  local_88 = "A";
  pcStack_80 = "B";
  local_78 = "C";
  local_158 = 3;
  ppcStack_160 = &local_88;
  WVar4 = MakeJsonAndVerify(&local_188,local_148,2,
                            "{\"ArrayStrFixed\":[\"a\",\"b\",\"c\"],\"StrArray\":[\"A\",\"B\",\"C\"]}"
                           );
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStruct, marshalStringStruct, ( sizeof(marshalStringStruct) / sizeof((marshalStringStruct)[0]) ), \"{\\\"ArrayStrFixed\\\":[\\\"a\\\",\\\"b\\\",\\\"c\\\"],\\\"StrArray\\\":[\\\"A\\\",\\\"B\\\",\\\"C\\\"]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStrings",0xe5);
  WVar5 = WJTL_STATUS_FAILED;
  if (((WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS) &&
      WVar3 == WJTL_STATUS_SUCCESS) && WVar4 == WJTL_STATUS_SUCCESS) {
    WVar5 = WJTL_STATUS_SUCCESS;
  }
  return WVar5;
}

Assistant:

static
WJTL_STATUS
    TestMarshallArrayStrings
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        char* ArrayStrFixed[4];
        size_t ArrayStrFixedCount;
        char** StrArray;
        size_t StrArrayCount;
    } StringStruct;

    JlMarshallElement marshalStringStruct[] =
    {
        JlMarshallStringFixedArray( StringStruct, ArrayStrFixed, ArrayStrFixedCount, "ArrayStrFixed" ),
        JlMarshallStringArray( StringStruct, StrArray, StrArrayCount, "StrArray" ),
    };

    StringStruct theStruct = {{0}};
    char* someStrings[10] = {0};
//    char* jsonString = NULL;

    // Check marshalling empty arrays
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[],\"StrArray\":[]}" ) );

    // Now try with arrays containing only a single NULL string
    theStruct.ArrayStrFixed[0] = NULL;
    theStruct.ArrayStrFixedCount = 1;
    theStruct.StrArray = someStrings;
    theStruct.StrArrayCount = 1;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}" ) );

    // Now try with arrays containing only a single empty string
    theStruct.ArrayStrFixed[0] = "";
    theStruct.ArrayStrFixedCount = 1;
    someStrings[0] = "";
    theStruct.StrArray = someStrings;
    theStruct.StrArrayCount = 1;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[null],\"StrArray\":[null]}" ) );

    // Now try regular strings
    theStruct.ArrayStrFixed[0] = "a";
    theStruct.ArrayStrFixed[1] = "b";
    theStruct.ArrayStrFixed[2] = "c";
    theStruct.ArrayStrFixedCount = 3;
    someStrings[0] = "A";
    someStrings[1] = "B";
    someStrings[2] = "C";
    theStruct.StrArray = someStrings;
    theStruct.StrArrayCount = 3;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStruct, marshalStringStruct, NumElements(marshalStringStruct),
                                          "{\"ArrayStrFixed\":[\"a\",\"b\",\"c\"],\"StrArray\":[\"A\",\"B\",\"C\"]}" ) );

    return TestReturn;
}